

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_refs_pushptr(MDD *ptr)

{
  undefined8 *puVar1;
  long *in_FS_OFFSET;
  MDD *ptr_local;
  
  if (*(long *)(*in_FS_OFFSET + -0x20) == 0) {
    lddmc_refs_init_key();
    lddmc_refs_pushptr(ptr);
  }
  else {
    puVar1 = *(undefined8 **)(*(long *)(*in_FS_OFFSET + -0x20) + 0x10);
    *(undefined8 **)(*(long *)(*in_FS_OFFSET + -0x20) + 0x10) = puVar1 + 1;
    *puVar1 = ptr;
    if (*(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x10) ==
        *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 8)) {
      lddmc_refs_ptrs_up(*(lddmc_refs_internal_t *)(*in_FS_OFFSET + -0x20));
    }
  }
  return;
}

Assistant:

void __attribute__((unused))
lddmc_refs_pushptr(const MDD *ptr)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    if (lddmc_refs_key == 0) {
        lddmc_refs_init_key();
        lddmc_refs_pushptr(ptr);
    } else {
        *lddmc_refs_key->pcur++ = ptr;
        if (lddmc_refs_key->pcur == lddmc_refs_key->pend) lddmc_refs_ptrs_up(lddmc_refs_key);
    }
}